

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdGetTaprootTweakedPrivkey
              (void *handle,void *tree_handle,char *internal_privkey,char **tweaked_privkey)

{
  Script *pSVar1;
  pointer puVar2;
  bool bVar3;
  char *pcVar4;
  CfdException *pCVar5;
  TapBranch *object;
  Privkey taproot_privkey;
  TapBranch branch;
  allocator local_109;
  string local_108;
  Privkey local_e8;
  string local_c8;
  TapBranch local_a8;
  
  cfd::Initialize();
  pSVar1 = &local_a8.script_;
  local_a8._vptr_TapBranch = (_func_int **)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_a8);
  if ((Script *)local_a8._vptr_TapBranch != pSVar1) {
    operator_delete(local_a8._vptr_TapBranch);
  }
  bVar3 = cfd::capi::IsEmptyString(internal_privkey);
  if (bVar3) {
    local_a8._vptr_TapBranch = (_func_int **)0x5e1390;
    local_a8.has_leaf_ = true;
    local_a8.leaf_version_ = '\x04';
    local_a8._10_2_ = 0;
    local_a8.script_._vptr_Script = (_func_int **)0x5e1959;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,
               "internal_privkey is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8._vptr_TapBranch = (_func_int **)pSVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Failed to parameter. internal_privkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tweaked_privkey == (char **)0x0) {
    local_a8._vptr_TapBranch = (_func_int **)0x5e1390;
    local_a8.has_leaf_ = true;
    local_a8.leaf_version_ = '\x04';
    local_a8._10_2_ = 0;
    local_a8.script_._vptr_Script = (_func_int **)0x5e1959;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,"tweaked_privkey is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8._vptr_TapBranch = (_func_int **)pSVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Failed to parameter. tweaked_privkey is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::TapBranch::TapBranch(&local_a8);
  object = (TapBranch *)**(long **)((long)tree_handle + 0x18);
  if ((object == (TapBranch *)(*(long **)((long)tree_handle + 0x18))[1]) &&
     (object = (TapBranch *)**(long **)((long)tree_handle + 0x10),
     (TapBranch *)(*(long **)((long)tree_handle + 0x10))[1] == object)) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  cfd::core::TapBranch::operator=(&local_a8,object);
  cfd::core::Privkey::Privkey(&local_e8);
  std::__cxx11::string::string((string *)&local_108,internal_privkey,(allocator *)&local_c8);
  bVar3 = cfd::core::Privkey::HasWif(&local_108,(NetType *)0x0,(bool *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_c8,internal_privkey,&local_109);
    cfd::core::Privkey::FromWif((Privkey *)&local_108,&local_c8,kCustomChain,true);
  }
  else {
    std::__cxx11::string::string((string *)&local_c8,internal_privkey,&local_109);
    cfd::core::Privkey::Privkey((Privkey *)&local_108,&local_c8,kMainnet,true);
  }
  puVar2 = local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_108._M_dataplus._M_p;
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_108._M_string_length;
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_108.field_2._M_allocated_capacity;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_108.field_2._M_allocated_capacity = 0;
  if (puVar2 == (pointer)0x0) {
    local_e8.is_compressed_ = (bool)local_108.field_2._M_local_buf[8];
    local_e8._25_3_ = local_108.field_2._9_3_;
    local_e8.net_type_ = local_108.field_2._12_4_;
  }
  else {
    operator_delete(puVar2);
    local_e8.is_compressed_ = (bool)local_108.field_2._M_local_buf[8];
    local_e8._25_3_ = local_108.field_2._9_3_;
    local_e8.net_type_ = local_108.field_2._12_4_;
    if (local_108._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  cfd::core::TapBranch::GetTweakedPrivkey((Privkey *)&local_108,&local_a8,&local_e8,(bool *)0x0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_c8,(Privkey *)&local_108);
  pcVar4 = cfd::capi::CreateString(&local_c8);
  *tweaked_privkey = pcVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_108._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::TapBranch::~TapBranch(&local_a8);
  return 0;
}

Assistant:

int CfdGetTaprootTweakedPrivkey(
    void* handle, void* tree_handle, const char* internal_privkey,
    char** tweaked_privkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (IsEmptyString(internal_privkey)) {
      warn(CFD_LOG_SOURCE, "internal_privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. internal_privkey is null or empty.");
    }
    if (tweaked_privkey == nullptr) {
      warn(CFD_LOG_SOURCE, "tweaked_privkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweaked_privkey is null.");
    }
    TapBranch branch;
    if (!buffer->branch_buffer->empty()) {
      branch = buffer->branch_buffer->at(0);
    } else {
      branch = buffer->tree_buffer->at(0);
    }
    Privkey privkey;
    if (Privkey::HasWif(internal_privkey)) {
      privkey = Privkey::FromWif(internal_privkey);
    } else {
      privkey = Privkey(internal_privkey);
    }
    auto taproot_privkey = branch.GetTweakedPrivkey(privkey);
    *tweaked_privkey = CreateString(taproot_privkey.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}